

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reference.cpp
# Opt level: O2

string * get_seq_from_reference
                   (string *__return_storage_ptr__,string *reference,
                   vector<chromosome_inf,_std::allocator<chromosome_inf>_> *chr_inf,
                   string *chromosome,uint64_t start,uint64_t end)

{
  pointer pcVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  char *__s;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var5;
  ostream *poVar6;
  uint32_t *puVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  char local_260 [8];
  ifstream ref_handle;
  allocator<char> local_31;
  
  pcVar1 = (chr_inf->super__Vector_base<chromosome_inf,_std::allocator<chromosome_inf>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = ((long)(chr_inf->super__Vector_base<chromosome_inf,_std::allocator<chromosome_inf>_>).
                 _M_impl.super__Vector_impl_data._M_finish - (long)pcVar1) / 0x38;
  puVar7 = &pcVar1->line_bases;
  lVar8 = 0;
  lVar9 = 0;
  while (bVar10 = lVar4 != 0, lVar4 = lVar4 + -1, bVar10) {
    iVar3 = strcmp((((chromosome_inf *)(puVar7 + -0xc))->chromosome)._M_dataplus._M_p,
                   (chromosome->_M_dataplus)._M_p);
    if (iVar3 == 0) {
      lVar9 = start / *puVar7 + *(uint64_t *)(puVar7 + -2) + start;
      lVar8 = end / *puVar7 + *(uint64_t *)(puVar7 + -2) + end;
    }
    puVar7 = puVar7 + 0xe;
  }
  std::ifstream::ifstream(local_260,(string *)reference,_S_in);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    __s = (char *)calloc((lVar8 - lVar9) + 1,1);
    std::istream::seekg((long)local_260,(_Ios_Seekdir)lVar9);
    std::istream::read(local_260,(long)__s);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,&local_31);
    _Var5._M_current = (__return_storage_ptr__->_M_dataplus)._M_p;
    local_31 = (allocator<char>)0xa;
    _Var5 = std::
            __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      (_Var5,_Var5._M_current + __return_storage_ptr__->_M_string_length,
                       (_Iter_equals_val<const_char>)&local_31);
    std::__cxx11::string::erase
              (__return_storage_ptr__,_Var5._M_current,
               (__return_storage_ptr__->_M_dataplus)._M_p + __return_storage_ptr__->_M_string_length
              );
    std::ifstream::close();
    std::ifstream::~ifstream(local_260);
    return __return_storage_ptr__;
  }
  poVar6 = std::operator<<((ostream *)&std::cerr,"cant open refernce file");
  std::endl<char,std::char_traits<char>>(poVar6);
  exit(-1);
}

Assistant:

string get_seq_from_reference(string reference ,const vector<chromosome_inf> * chr_inf, string chromosome, uint64_t start , uint64_t end){
    uint64_t offset_start = 0;
    uint64_t offset_end = 0;
    for (size_t i = 0 ; i < (*chr_inf).size() ;i++){
        // uint64_t start_offset;
        // uint32_t line_bases;
        // uint32_t line_width;
        if ( strcmp ( (*chr_inf)[i].chromosome.c_str(), chromosome.c_str()) == 0){
            offset_start = (*chr_inf)[i].start_offset + start + start/(*chr_inf)[i].line_bases;
            offset_end = (*chr_inf)[i].start_offset + end + end/(*chr_inf)[i].line_bases;
        }
    }
    
    ifstream ref_handle (reference );
    if (ref_handle.is_open()){
        char * buffer =  (char *)calloc(offset_end-offset_start+1,sizeof(char));
        ref_handle.seekg(offset_start,ios::beg);  
        ref_handle.read(buffer,offset_end-offset_start);

        // std:remove(buffer, buffer+strlen(buffer), '\n') == '\0';
        string buff_string(buffer);
        buff_string.erase(std::remove(buff_string.begin(), buff_string.end(), '\n'), buff_string.end());
        ref_handle.close();
        return buff_string;
    }else{
        cerr << "cant open refernce file"<< endl;
        exit(-1);
    }
}